

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBooleanElementwiseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  LayerCase LVar2;
  Result local_d8;
  Result local_b0;
  Result local_88;
  Result local_60;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  LVar2 = Specification::NeuralNetworkLayer::layer_case(local_20);
  if (LVar2 == kLogicalNot) {
    validateInputCount(&local_60,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_60);
    Result::~Result(&local_60);
  }
  else {
    LVar2 = Specification::NeuralNetworkLayer::layer_case(local_20);
    if (((LVar2 == kLogicalAnd) ||
        (LVar2 = Specification::NeuralNetworkLayer::layer_case(local_20), LVar2 == kLogicalOr)) ||
       (LVar2 = Specification::NeuralNetworkLayer::layer_case(local_20), LVar2 == kLogicalXor)) {
      validateInputCount(&local_88,local_20,2,2);
      Result::operator=(__return_storage_ptr__,&local_88);
      Result::~Result(&local_88);
    }
    else {
      validateInputCount(&local_b0,local_20,1,2);
      Result::operator=(__return_storage_ptr__,&local_b0);
      Result::~Result(&local_b0);
    }
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount(&local_d8,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_d8);
    Result::~Result(&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBooleanElementwiseLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalNot) {
        r = validateInputCount(layer, 1, 1);
    } else if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalAnd ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalOr ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalXor) {
        r = validateInputCount(layer, 2, 2);
    } else {
        r = validateInputCount(layer, 1, 2);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}